

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

float __thiscall
TPZMatrix<float>::ConditionNumber(TPZMatrix<float> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  float fVar2;
  TPZFMatrix<float> Inv;
  float local_c4;
  TPZFMatrix<float> local_b8;
  
  local_b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_b8.fElem = (float *)0x0;
  local_b8.fGiven = (float *)0x0;
  local_b8.fSize = 0;
  TPZVec<int>::TPZVec(&local_b8.fPivot.super_TPZVec<int>,0);
  local_b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_b8.fPivot.super_TPZVec<int>.fStore = local_b8.fPivot.fExtAlloc;
  local_b8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_b8.fWork.fStore = (float *)0x0;
  local_b8.fWork.fNElements = 0;
  local_b8.fWork.fNAlloc = 0;
  local_c4 = MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_b8,ENoDecompose);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<float>::ConditionNumber(int, int64_t, REAL) [TVar = float]",0x49);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - it was not possible to compute the inverse matrix.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    local_c4 = 0.0;
    std::ostream::flush();
  }
  else {
    fVar2 = MatrixNorm(&local_b8.super_TPZMatrix<float>,p,numiter,tol);
    local_c4 = local_c4 * fVar2;
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_b8);
  return local_c4;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}